

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesCacheEntryComposite.cxx
# Opt level: O1

void __thiscall
cmCursesCacheEntryComposite::cmCursesCacheEntryComposite
          (cmCursesCacheEntryComposite *this,string *key,int labelwidth,int entrywidth)

{
  pointer pcVar1;
  cmCursesLabelWidget *pcVar2;
  cmCursesStringWidget *this_00;
  string local_50;
  
  (this->Key)._M_dataplus._M_p = (pointer)&(this->Key).field_2;
  pcVar1 = (key->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Key,pcVar1,pcVar1 + key->_M_string_length);
  this->LabelWidth = labelwidth;
  this->EntryWidth = entrywidth;
  pcVar2 = (cmCursesLabelWidget *)operator_new(0x40);
  cmCursesLabelWidget::cmCursesLabelWidget(pcVar2,labelwidth,1,1,1,key);
  this->Label = pcVar2;
  pcVar2 = (cmCursesLabelWidget *)operator_new(0x40);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50," ","");
  cmCursesLabelWidget::cmCursesLabelWidget(pcVar2,1,1,1,1,&local_50);
  this->IsNewLabel = pcVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this->Entry = (cmCursesWidget *)0x0;
  this_00 = (cmCursesStringWidget *)operator_new(0x50);
  cmCursesStringWidget::cmCursesStringWidget(this_00,this->EntryWidth,1,1,1);
  this->Entry = (cmCursesWidget *)this_00;
  return;
}

Assistant:

cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(
                                                        const std::string& key,
                                                        int labelwidth,
                                                        int entrywidth) :
  Key(key), LabelWidth(labelwidth), EntryWidth(entrywidth)
{
  this->Label = new cmCursesLabelWidget(this->LabelWidth, 1, 1, 1, key);
  this->IsNewLabel = new cmCursesLabelWidget(1, 1, 1, 1, " ");
  this->Entry = 0;
  this->Entry = new cmCursesStringWidget(this->EntryWidth, 1, 1, 1);
}